

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalGenerator::GenerateCMakeBuildCommand
          (string *__return_storage_ptr__,cmGlobalGenerator *this,string *target,string *config,
          string *native,bool ignoreErrors)

{
  int iVar1;
  string *psVar2;
  ulong uVar3;
  undefined4 extraout_var;
  undefined1 auVar5 [16];
  char *iflag;
  char *sep;
  string local_58;
  undefined1 local_32;
  byte local_31;
  string *psStack_30;
  bool ignoreErrors_local;
  string *native_local;
  string *config_local;
  string *target_local;
  cmGlobalGenerator *this_local;
  string *makeCommand;
  char *pcVar4;
  
  local_32 = 0;
  local_31 = ignoreErrors;
  psStack_30 = native;
  native_local = config;
  config_local = target;
  target_local = (string *)this;
  this_local = (cmGlobalGenerator *)__return_storage_ptr__;
  psVar2 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  auVar5 = std::__cxx11::string::c_str();
  cmSystemTools::ConvertToOutputPath_abi_cxx11_(&local_58,auVar5._0_8_,auVar5._8_8_);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__," --build .");
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," --config \"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)native_local);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," --target \"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)config_local);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
  }
  iflag = " -- ";
  if ((local_31 & 1) != 0) {
    iVar1 = (*this->_vptr_cmGlobalGenerator[0x2d])();
    pcVar4 = (char *)CONCAT44(extraout_var,iVar1);
    if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," -- ");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar4);
      iflag = " ";
    }
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,iflag);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psStack_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::GenerateCMakeBuildCommand(
  const std::string& target, const std::string& config,
  const std::string& native, bool ignoreErrors)
{
  std::string makeCommand = cmSystemTools::GetCMakeCommand();
  makeCommand = cmSystemTools::ConvertToOutputPath(makeCommand.c_str());
  makeCommand += " --build .";
  if (!config.empty()) {
    makeCommand += " --config \"";
    makeCommand += config;
    makeCommand += "\"";
  }
  if (!target.empty()) {
    makeCommand += " --target \"";
    makeCommand += target;
    makeCommand += "\"";
  }
  const char* sep = " -- ";
  if (ignoreErrors) {
    const char* iflag = this->GetBuildIgnoreErrorsFlag();
    if (iflag && *iflag) {
      makeCommand += sep;
      makeCommand += iflag;
      sep = " ";
    }
  }
  if (!native.empty()) {
    makeCommand += sep;
    makeCommand += native;
  }
  return makeCommand;
}